

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.hpp
# Opt level: O2

unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridFourier>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridFourier> *this,AccelerationContext *acc,istream *is)

{
  bool bVar1;
  int iVar2;
  int max_level;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  long lVar4;
  MultiIndexSet *mset;
  int in_R8D;
  OneDimensionalWrapper local_e0;
  AccelerationContext *acc_local;
  
  acc_local = acc;
  Utils::make_unique<TasGrid::GridFourier,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,&acc_local);
  iVar2 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(is);
  *(int *)(*(long *)this + 0x10) = iVar2;
  iVar2 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(is);
  lVar4 = *(long *)this;
  *(int *)(lVar4 + 0x14) = iVar2;
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)&local_e0,is);
  iVar2 = (int)lVar4;
  MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x148),(MultiIndexSet *)&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)&local_e0,is);
  MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x170),(MultiIndexSet *)&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            ((vector<int,_std::allocator<int>_> *)&local_e0,(IO *)is,
             (istream *)(ulong)*(uint *)(*(long *)this + 0x178),iVar2);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x198),&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_e0);
  bVar1 = IO::readFlag<TasGrid::IO::mode_ascii_type>(is);
  if (bVar1) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)&local_e0,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x18),(MultiIndexSet *)&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
  }
  bVar1 = IO::readFlag<TasGrid::IO::mode_ascii_type>(is);
  if (bVar1) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)&local_e0,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x40),(MultiIndexSet *)&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
  }
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            ((vector<int,_std::allocator<int>_> *)&local_e0,(IO *)is,
             (istream *)(ulong)*(uint *)(*(long *)this + 0x10),iVar2);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x218),&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_e0);
  if (0 < *(int *)(*(long *)this + 0x14)) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>((StorageSet *)&local_e0,is);
    StorageSet::operator=((StorageSet *)(*(long *)this + 0x68),(StorageSet *)&local_e0);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_e0.num_points);
    bVar1 = IO::readFlag<TasGrid::IO::mode_ascii_type>(is);
    if (bVar1) {
      iVar2 = *(int *)(*(long *)this + 0x20) * 2;
      IO::readData2D<TasGrid::IO::mode_ascii_type,double,int,int>
                ((Data2D<double> *)&local_e0,(IO *)is,
                 (istream *)(ulong)*(uint *)(*(long *)this + 0x14),iVar2,in_R8D);
      Data2D<double>::operator=
                ((Data2D<double> *)(*(long *)this + 0x230),(Data2D<double> *)&local_e0);
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_e0.num_points);
    }
  }
  bVar1 = IO::readFlag<TasGrid::IO::mode_ascii_type>(is);
  if (bVar1) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)&local_e0,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x1b0),(MultiIndexSet *)&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
    max_level = MultiIndexSet::getMaxIndex((MultiIndexSet *)(*(long *)this + 0x1b0));
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)&local_e0,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x1d8),(MultiIndexSet *)&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
              ((vector<int,_std::allocator<int>_> *)&local_e0,(IO *)is,
               (istream *)(ulong)*(uint *)(*(long *)this + 0x1e0),iVar2);
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x200),&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_e0);
  }
  else {
    _Var3 = ::std::
            __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (*(undefined8 *)(*(long *)this + 0x218),*(undefined8 *)(*(long *)this + 0x220)
                      );
    max_level = *_Var3._M_current;
  }
  OneDimensionalWrapper::OneDimensionalWrapper(&local_e0,max_level,rule_fourier,0.0,0.0);
  OneDimensionalWrapper::operator=((OneDimensionalWrapper *)(*(long *)this + 0x90),&local_e0);
  OneDimensionalWrapper::~OneDimensionalWrapper(&local_e0);
  lVar4 = *(long *)this;
  mset = (MultiIndexSet *)(lVar4 + 0x18);
  if (*(long *)(lVar4 + 0x28) == *(long *)(lVar4 + 0x30)) {
    mset = (MultiIndexSet *)(lVar4 + 0x40);
  }
  MultiIndexManipulations::getMaxIndexes((vector<int,_std::allocator<int>_> *)&local_e0,mset);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(*(long *)this + 600),&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_e0);
  return (__uniq_ptr_data<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridFourier> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridFourier> grid = Utils::make_unique<GridFourier>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);

        grid->tensors = MultiIndexSet(is, iomode());
        grid->active_tensors = MultiIndexSet(is, iomode());
        grid->active_w = IO::readVector<iomode, int>(is, grid->active_tensors.getNumIndexes());

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        grid->max_levels = IO::readVector<iomode, int>(is, grid->num_dimensions);

        if (grid->num_outputs > 0){
            grid->values = StorageSet(is, iomode());
            if (IO::readFlag<iomode>(is))
                grid->fourier_coefs = IO::readData2D<iomode, double>(is, grid->num_outputs, 2 * grid->points.getNumIndexes());
        }

        int oned_max_level;
        if (IO::readFlag<iomode>(is)){
            grid->updated_tensors = MultiIndexSet(is, iomode());
            oned_max_level = grid->updated_tensors.getMaxIndex();

            grid->updated_active_tensors = MultiIndexSet(is, iomode());

            grid->updated_active_w = IO::readVector<iomode, int>(is, grid->updated_active_tensors.getNumIndexes());
        }else{
            oned_max_level = *std::max_element(grid->max_levels.begin(), grid->max_levels.end());
        }

        grid->wrapper = OneDimensionalWrapper(oned_max_level, rule_fourier, 0.0, 0.0);

        grid->max_power = MultiIndexManipulations::getMaxIndexes(((grid->points.empty()) ? grid->needed : grid->points));

        return grid;
    }